

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int includes_nul(char *s,size_t n)

{
  void *pvVar1;
  size_t n_local;
  char *s_local;
  
  if (n == 0) {
    s_local._4_4_ = 0;
  }
  else {
    pvVar1 = memchr(s + 1,0,n - 1);
    s_local._4_4_ = (uint)(pvVar1 != (void *)0x0);
  }
  return s_local._4_4_;
}

Assistant:

static int includes_nul(const char *s, size_t n) {
  if (n == 0)
    return 0;
#ifdef __linux__
  /* Accept abstract socket namespace path ("\0/virtual/path"). */
  s++;
  n--;
#endif
  return NULL != memchr(s, '\0', n);
}